

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkroom.c
# Opt level: O2

void mkgarden(level *lev,mkroom *croom)

{
  undefined1 *puVar1;
  xchar xVar2;
  xchar xVar3;
  boolean bVar4;
  schar sVar5;
  uint uVar6;
  permonst *ptr;
  monst *pmVar7;
  bool bVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  mkroom *sroom;
  coord pos;
  
  uVar10 = 0;
  bVar8 = true;
LAB_001d81d1:
  do {
    if ((!bVar8) || (0x18 < uVar10)) {
      return;
    }
    uVar10 = uVar10 + 1;
    if (croom == (mkroom *)0x0) goto LAB_001d835d;
    bVar8 = true;
    sroom = croom;
  } while (croom->hx < '\0');
  goto LAB_001d81f9;
LAB_001d835d:
  uVar6 = rn2(lev->nroom);
  bVar8 = true;
  if (-1 < lev->rooms[uVar6].hx) {
    sroom = lev->rooms + uVar6;
    bVar8 = true;
    if ((sroom->rtype == '\0') && (bVar8 = true, sroom->rlit != '\0')) {
      bVar4 = has_upstairs(lev,sroom);
      bVar8 = true;
      if (bVar4 == '\0') {
        bVar4 = has_dnstairs(lev,sroom);
        bVar8 = true;
        if (bVar4 == '\0') {
LAB_001d81f9:
          sroom->rtype = '\x0e';
          puVar1 = &(lev->flags).field_0x8;
          *puVar1 = *puVar1 | 0x20;
          uVar6 = mt_random();
          uVar13 = 0;
          iVar11 = uVar6 % 5 + 3;
          while (((uVar13 < 0x32 && (-1 < iVar11)) &&
                 (bVar4 = somexy(lev,sroom,&pos), xVar3 = pos.y, xVar2 = pos.x, bVar4 != '\0'))) {
            pmVar7 = lev->monsters[pos.x][pos.y];
            if (((pmVar7 == (monst *)0x0) || ((pmVar7->field_0x61 & 2) != 0)) &&
               (ptr = mkclass(&lev->z,'\x0e',0), ptr != (permonst *)0x0)) {
              pmVar7 = makemon(ptr,lev,(int)xVar2,(int)xVar3,0);
              if (pmVar7 != (monst *)0x0) {
                pmVar7->field_0x62 = pmVar7->field_0x62 | 8;
              }
              uVar13 = uVar13 + 1;
              iVar11 = iVar11 + -1;
            }
            else {
              uVar13 = uVar13 + 1;
            }
          }
          uVar6 = mt_random();
          uVar13 = 0;
          iVar11 = uVar6 % 3 + 3;
          while (((uVar13 < 0x32 && (-1 < iVar11)) &&
                 (bVar4 = somexy(lev,sroom,&pos), bVar4 != '\0'))) {
            lVar12 = (long)pos.x;
            lVar9 = (long)pos.y;
            if ((lev->locations[lVar12][lVar9].typ == '\x19') &&
               (((pmVar7 = lev->monsters[lVar12][lVar9], pmVar7 == (monst *)0x0 ||
                 ((pmVar7->field_0x61 & 2) != 0)) &&
                (bVar4 = nexttodoor(lev,(int)pos.x,(int)pos.y), bVar4 == '\0')))) {
              uVar6 = mt_random();
              sVar5 = '\r';
              if (uVar6 % 3 == 0) {
                (lev->flags).nfountains = (lev->flags).nfountains + '\x01';
                sVar5 = '\x1c';
              }
              uVar13 = uVar13 + 1;
              lev->locations[lVar12][lVar9].typ = sVar5;
              iVar11 = iVar11 + -1;
            }
            else {
              uVar13 = uVar13 + 1;
            }
          }
          bVar8 = false;
        }
      }
    }
  }
  goto LAB_001d81d1;
}

Assistant:

static void mkgarden(struct level *lev, struct mkroom *croom)
{
	int tryct = 0;
	boolean maderoom = FALSE;
	coord pos;
	int i, tried;

	while ((tryct++ < 25) && !maderoom) {
	    struct mkroom *sroom = croom ? croom : &lev->rooms[rn2(lev->nroom)];

	    if (sroom->hx < 0 || (!croom &&
		    (sroom->rtype != OROOM || !sroom->rlit ||
		    has_upstairs(lev, sroom) || has_dnstairs(lev, sroom))))
		continue;

	    sroom->rtype = GARDEN;
	    maderoom = TRUE;
	    lev->flags.has_garden = 1;

	    tried = 0;
	    i = rn1(5, 3);
	    while ((tried++ < 50) && (i >= 0) && somexy(lev, sroom, &pos)) {
		const struct permonst *pmon;
		if (!MON_AT(lev, pos.x, pos.y) && (pmon = mkclass(&lev->z, S_NYMPH, 0))) {
		    struct monst *mtmp = makemon(pmon, lev, pos.x, pos.y, NO_MM_FLAGS);
		    if (mtmp) mtmp->msleeping = 1;
		    i--;
		}
	    }

	    tried = 0;
	    i = rn1(3, 3);
	    while ((tried++ < 50) && (i >= 0) && somexy(lev, sroom, &pos)) {
		if (lev->locations[pos.x][pos.y].typ == ROOM && !MON_AT(lev, pos.x, pos.y) &&
			!nexttodoor(lev, pos.x, pos.y)) {
		    if (rn2(3)) {
			lev->locations[pos.x][pos.y].typ = TREE;
		    } else {
			lev->locations[pos.x][pos.y].typ = FOUNTAIN;
			lev->flags.nfountains++;
		    }
		    i--;
		}
	    }
	}
}